

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

void solver_debug_check(solver_t *s,int result)

{
  FILE *__stream;
  uint uVar1;
  clause_conflict *clause_00;
  clause_conflict *clause;
  uint j;
  uint i;
  uint cref;
  int result_local;
  solver_t *s_local;
  
  solver_debug_check_trail(s);
  __stream = _stdout;
  uVar1 = vec_uint_size(s->originals);
  fprintf(__stream,"[Satoko] Checking clauses (%d)... \n",(ulong)uVar1);
  clause._4_4_ = 0;
  while( true ) {
    uVar1 = vec_uint_size(s->originals);
    if (uVar1 <= clause._4_4_) {
      fprintf(_stdout,"[Satoko] All SAT - OK\n");
      return;
    }
    uVar1 = vec_uint_at(s->originals,clause._4_4_);
    clause_00 = clause_fetch(s,uVar1);
    clause._0_4_ = 0;
    while (((uint)clause < clause_00->size &&
           (uVar1 = vec_uint_find(s->trail,*(uint *)(&clause_00[1].field_0x0 +
                                                    (ulong)(uint)clause * 4)), uVar1 == 0))) {
      clause._0_4_ = (uint)clause + 1;
    }
    if ((result == 1) && ((uint)clause == clause_00->size)) break;
    clause._4_4_ = clause._4_4_ + 1;
  }
  fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE: (%d) ",(ulong)clause._4_4_);
  clause_print(clause_00);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                ,0x2fd,"void solver_debug_check(solver_t *, int)");
}

Assistant:

void solver_debug_check(solver_t *s, int result)
{
    unsigned cref, i;
    solver_debug_check_trail(s);
    fprintf(stdout, "[Satoko] Checking clauses (%d)... \n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, clause->data[j].lit)) {
                break;
            }
        }
        if (result == SATOKO_SAT && j == clause->size) {
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}